

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
          (ScopedFakeTestPartResultReporter *this)

{
  TestPartResultReporterInterface *reporter;
  TestPartResultReporterInterface **ppTVar1;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__ScopedFakeTestPartResultReporter_001504c0;
  UnitTest::GetInstance();
  reporter = this->old_reporter_;
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    internal::UnitTestImpl::SetGlobalTestPartResultReporter
              (UnitTest::GetInstance::instance.impl_,reporter);
  }
  else {
    ppTVar1 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                        (&(UnitTest::GetInstance::instance.impl_)->
                          per_thread_test_part_result_reporter_);
    *ppTVar1 = reporter;
  }
  return;
}

Assistant:

ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    impl->SetGlobalTestPartResultReporter(old_reporter_);
  } else {
    impl->SetTestPartResultReporterForCurrentThread(old_reporter_);
  }
}